

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall ACSStringPool::MarkStringMap(ACSStringPool *this,FWorldGlobalArray *aray)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  Node *pNVar4;
  PoolEntry *pPVar5;
  bool bVar6;
  IPair *in_R8;
  uint uVar7;
  uint uVar8;
  IPair *pIVar9;
  
  uVar2 = aray->Size;
  pNVar4 = aray->Nodes;
  uVar3 = (this->Pool).Count;
  pPVar5 = (this->Pool).Array;
  uVar7 = 0;
  do {
    if (uVar7 < uVar2) {
      pIVar9 = &pNVar4[uVar7].Pair;
      do {
        uVar7 = uVar7 + 1;
        if (((Node *)(pIVar9 + -1))->Next != (Node *)0x1) {
          bVar6 = true;
          in_R8 = pIVar9;
          goto LAB_003add85;
        }
        pIVar9 = pIVar9 + 2;
      } while (uVar7 != uVar2);
      bVar6 = false;
      uVar7 = uVar2;
    }
    else {
      bVar6 = false;
    }
LAB_003add85:
    if (!bVar6) {
      return;
    }
    if (((in_R8->Value & 0xfff00000U) == 0x7ff00000) &&
       (uVar8 = in_R8->Value & 0xfffff, uVar8 < uVar3)) {
      pbVar1 = (byte *)((long)&pPVar5[uVar8].LockCount + 3);
      *pbVar1 = *pbVar1 | 0x80;
    }
  } while( true );
}

Assistant:

void ACSStringPool::MarkStringMap(const FWorldGlobalArray &aray)
{
	FWorldGlobalArray::ConstIterator it(aray);
	FWorldGlobalArray::ConstPair *pair;

	while (it.NextPair(pair))
	{
		int num = pair->Value;
		if ((num & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR)
		{
			num &= ~LIBRARYID_MASK;
			if ((unsigned)num < Pool.Size())
			{
				Pool[num].LockCount |= 0x80000000;
			}
		}
	}
}